

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O3

int av1_postencode_drop_cbr(AV1_COMP *cpi,size_t *size)

{
  _Bool _Var1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  int *piVar4;
  RefCntBuffer *pRVar5;
  int64_t iVar6;
  LAYER_CONTEXT *pLVar7;
  byte bVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  int8_t iVar16;
  int8_t iVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  MV_STATS *pMVar23;
  MV_STATS *pMVar24;
  bool bVar25;
  byte bVar26;
  
  bVar26 = 0;
  iVar21 = 0;
  if ((cpi->rc).high_source_sad != 0) {
    return 0;
  }
  iVar2 = (cpi->rc).avg_frame_bandwidth;
  if ((((ulong)(uint)(iVar2 * 8) < *size * 8) &&
      (pAVar3 = cpi->ppi,
      (long)((long)iVar2 + *size * -8 + (pAVar3->p_rc).buffer_level) <
      (pAVar3->p_rc).optimal_buffer_level >> 2)) &&
     (iVar19 = (cpi->rc).worst_quality >> 2, iVar2 = (cpi->common).quant_params.base_qindex,
     SBORROW4(iVar2,iVar19 * 3) != iVar2 + iVar19 * -3 < 0)) {
    *size = 0;
    cpi->is_dropped_frame = true;
    iVar21 = (cpi->coding_context).lf.filter_level_u;
    iVar2 = (cpi->coding_context).lf.filter_level_v;
    uVar9 = *(undefined8 *)(cpi->coding_context).lf.backup_filter_level;
    iVar19 = (cpi->coding_context).lf.backup_filter_level_u;
    iVar18 = (cpi->coding_context).lf.backup_filter_level_v;
    iVar13 = (cpi->coding_context).lf.sharpness_level;
    uVar14 = (cpi->coding_context).lf.mode_ref_delta_enabled;
    uVar15 = (cpi->coding_context).lf.mode_ref_delta_update;
    iVar16 = (cpi->coding_context).lf.ref_deltas[0];
    iVar17 = (cpi->coding_context).lf.ref_deltas[1];
    uVar10 = *(undefined8 *)((cpi->coding_context).lf.ref_deltas + 2);
    uVar11 = *(undefined8 *)(cpi->coding_context).cdef_info.cdef_strengths;
    uVar12 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 2);
    *(undefined8 *)(cpi->common).lf.filter_level =
         *(undefined8 *)(cpi->coding_context).lf.filter_level;
    (cpi->common).lf.filter_level_u = iVar21;
    (cpi->common).lf.filter_level_v = iVar2;
    *(undefined8 *)(cpi->common).lf.backup_filter_level = uVar9;
    (cpi->common).lf.backup_filter_level_u = iVar19;
    (cpi->common).lf.backup_filter_level_v = iVar18;
    (cpi->common).lf.sharpness_level = iVar13;
    (cpi->common).lf.mode_ref_delta_enabled = uVar14;
    (cpi->common).lf.mode_ref_delta_update = uVar15;
    (cpi->common).lf.ref_deltas[0] = iVar16;
    (cpi->common).lf.ref_deltas[1] = iVar17;
    *(undefined8 *)((cpi->common).lf.ref_deltas + 2) = uVar10;
    (cpi->common).cdef_info.cdef_bits = (cpi->coding_context).cdef_info.cdef_bits;
    *(undefined8 *)(cpi->common).cdef_info.cdef_strengths = uVar11;
    *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 2) = uVar12;
    uVar9 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 6);
    *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 4) =
         *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 4);
    *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 6) = uVar9;
    uVar9 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 10);
    *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 8) =
         *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 8);
    *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 10) = uVar9;
    uVar9 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xe);
    *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xc) =
         *(undefined8 *)((cpi->coding_context).cdef_info.cdef_strengths + 0xc);
    *(undefined8 *)((cpi->common).cdef_info.cdef_strengths + 0xe) = uVar9;
    uVar9 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 2);
    *(undefined8 *)(cpi->common).cdef_info.cdef_uv_strengths =
         *(undefined8 *)(cpi->coding_context).cdef_info.cdef_uv_strengths;
    *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 2) = uVar9;
    uVar9 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 6);
    *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 4) =
         *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 4);
    *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 6) = uVar9;
    uVar9 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 10);
    *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 8) =
         *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 8);
    *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 10) = uVar9;
    uVar9 = *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xe);
    *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xc) =
         *(undefined8 *)((cpi->coding_context).cdef_info.cdef_uv_strengths + 0xc);
    *(undefined8 *)((cpi->common).cdef_info.cdef_uv_strengths + 0xe) = uVar9;
    iVar21 = (cpi->coding_context).cdef_info.nb_cdef_strengths;
    (cpi->common).cdef_info.cdef_damping = (cpi->coding_context).cdef_info.cdef_damping;
    (cpi->common).cdef_info.nb_cdef_strengths = iVar21;
    memcpy(&cpi->rc,&(cpi->coding_context).rc,0x140);
    pMVar23 = &(cpi->coding_context).mv_stats;
    pMVar24 = &pAVar3->mv_stats;
    for (lVar20 = 9; lVar20 != 0; lVar20 = lVar20 + -1) {
      iVar21 = pMVar23->q;
      pMVar24->high_prec = pMVar23->high_prec;
      pMVar24->q = iVar21;
      pMVar23 = (MV_STATS *)((long)pMVar23 + (ulong)bVar26 * -0x10 + 8);
      pMVar24 = (MV_STATS *)((long)pMVar24 + ((ulong)bVar26 * -2 + 1) * 8);
    }
    (pAVar3->mv_stats).valid = (cpi->coding_context).mv_stats.valid;
    if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
      _Var1 = (cpi->refresh_frame).golden_frame;
      bVar26 = 1;
      lVar20 = 0x85a7;
      do {
        piVar4 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar20 * 8)
        ;
        if (lVar20 == 0x85aa) {
          if (((((cpi->oxcf).pass == AOM_RC_ONE_PASS) && (cpi->ppi->lap_enabled == 0)) &&
              (((cpi->oxcf).mode == '\x01' &&
               (((cpi->oxcf).gf_cfg.lag_in_frames == 0 && (cpi->ppi->use_svc == 0)))))) &&
             (piVar4 != (int *)0x0)) {
            pRVar5 = (cpi->common).ref_frame_map[(cpi->common).remapped_ref_idx[3]];
            if (piVar4[0x13c] == (pRVar5->buf).field_2.field_0.y_crop_width) {
              bVar25 = piVar4[0x13e] == (pRVar5->buf).field_3.field_0.y_crop_height;
            }
            else {
              bVar25 = false;
            }
            bVar8 = 1;
            if ((_Var1 != false) || (bVar25)) {
LAB_0020a08a:
              *piVar4 = *piVar4 + -1;
              *(undefined8 *)
               ((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar20 * 8) = 0;
              bVar26 = bVar8;
            }
            else {
              bVar26 = 0;
            }
          }
          else {
            bVar8 = 1;
            if (!(bool)(~bVar26 & 1 | piVar4 == (int *)0x0)) goto LAB_0020a08a;
            bVar26 = piVar4 == (int *)0x0 & bVar26;
          }
        }
        else {
          bVar8 = bVar26;
          if (piVar4 != (int *)0x0) goto LAB_0020a08a;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x85ae);
    }
    av1_rc_postencode_update_drop_frame(cpi);
    (cpi->rc).force_max_q = 1;
    iVar2 = (cpi->rc).worst_quality;
    (pAVar3->p_rc).avg_frame_qindex[1] = iVar2;
    iVar6 = (pAVar3->p_rc).optimal_buffer_level;
    (pAVar3->p_rc).buffer_level = iVar6;
    (pAVar3->p_rc).bits_off_target = iVar6;
    (cpi->rc).rc_1_frame = 0;
    (cpi->rc).rc_2_frame = 0;
    iVar19 = (cpi->svc).number_spatial_layers;
    if ((1 < iVar19) || (iVar21 = 1, iVar19 == 1 && 1 < (cpi->svc).number_temporal_layers)) {
      iVar21 = (cpi->svc).number_temporal_layers;
      iVar18 = 0;
      do {
        if (0 < iVar21) {
          pLVar7 = (cpi->svc).layer_context;
          lVar20 = 0;
          do {
            lVar22 = iVar21 * iVar18 + lVar20;
            pLVar7[lVar22].rc.force_max_q = 1;
            pLVar7[lVar22].p_rc.avg_frame_qindex[1] = iVar2;
            iVar6 = pLVar7[lVar22].p_rc.optimal_buffer_level;
            pLVar7[lVar22].p_rc.buffer_level = iVar6;
            pLVar7[lVar22].p_rc.bits_off_target = iVar6;
            pLVar7[lVar22].rc.rc_1_frame = 0;
            pLVar7[lVar22].rc.rc_2_frame = 0;
            iVar21 = (cpi->svc).number_temporal_layers;
            lVar20 = lVar20 + 1;
          } while ((int)lVar20 < iVar21);
          iVar19 = (cpi->svc).number_spatial_layers;
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 < iVar19);
      iVar21 = 1;
    }
  }
  return iVar21;
}

Assistant:

int av1_postencode_drop_cbr(AV1_COMP *cpi, size_t *size) {
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  size_t frame_size = *size << 3;
  const int64_t new_buffer_level =
      p_rc->buffer_level + cpi->rc.avg_frame_bandwidth - (int64_t)frame_size;
  // Drop if new buffer level (given the encoded frame size) goes below a
  // threshold and encoded frame size is much larger than per-frame-bandwidth.
  // If the frame is already labelled as scene change (high_source_sad = 1)
  // or the QP is close to max, then no need to drop.
  const int qp_thresh = 3 * (cpi->rc.worst_quality >> 2);
  const int64_t buffer_thresh = p_rc->optimal_buffer_level >> 2;
  if (!cpi->rc.high_source_sad && new_buffer_level < buffer_thresh &&
      frame_size > 8 * (unsigned int)cpi->rc.avg_frame_bandwidth &&
      cpi->common.quant_params.base_qindex < qp_thresh) {
    *size = 0;
    cpi->is_dropped_frame = true;
    restore_all_coding_context(cpi);
    av1_rc_postencode_update_drop_frame(cpi);
    // Force max_q on next fame. Reset some RC parameters.
    cpi->rc.force_max_q = 1;
    p_rc->avg_frame_qindex[INTER_FRAME] = cpi->rc.worst_quality;
    p_rc->buffer_level = p_rc->optimal_buffer_level;
    p_rc->bits_off_target = p_rc->optimal_buffer_level;
    cpi->rc.rc_1_frame = 0;
    cpi->rc.rc_2_frame = 0;
    if (cpi->svc.number_spatial_layers > 1 ||
        cpi->svc.number_temporal_layers > 1) {
      SVC *svc = &cpi->svc;
      // Postencode drop is only checked on base spatial layer,
      // for now if max-q is set on base we force it on all layers.
      for (int sl = 0; sl < svc->number_spatial_layers; ++sl) {
        for (int tl = 0; tl < svc->number_temporal_layers; ++tl) {
          const int layer =
              LAYER_IDS_TO_IDX(sl, tl, svc->number_temporal_layers);
          LAYER_CONTEXT *lc = &svc->layer_context[layer];
          RATE_CONTROL *lrc = &lc->rc;
          PRIMARY_RATE_CONTROL *lp_rc = &lc->p_rc;
          // Force max_q on next fame. Reset some RC parameters.
          lrc->force_max_q = 1;
          lp_rc->avg_frame_qindex[INTER_FRAME] = cpi->rc.worst_quality;
          lp_rc->buffer_level = lp_rc->optimal_buffer_level;
          lp_rc->bits_off_target = lp_rc->optimal_buffer_level;
          lrc->rc_1_frame = 0;
          lrc->rc_2_frame = 0;
        }
      }
    }
    return 1;
  }
  return 0;
}